

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  char *pcVar1;
  cmValue *this;
  int *piVar2;
  int *piVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_02;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_03;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_04;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar10;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_05;
  string_view value;
  string_view value_00;
  pair<bool,_const_char_*> pVar11;
  string null_ptr;
  allocator<char> local_71;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  long local_68;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char *extraout_RDX;
  
  pcVar1 = local_48._M_local_buf + 8;
  local_48._8_4_ = 0x736e7528;
  local_48._M_allocated_capacity = 7;
  local_48._12_4_ = 0x297465;
  this = (cmValue *)lhs->_M_string_length;
  local_60._16_8_ = pcVar1;
  if (this == (cmValue *)0x7) {
    piVar2 = (int *)(lhs->_M_dataplus)._M_p;
    if (((*(int *)((long)piVar2 + 3) == 0x29746573 && *piVar2 == 0x736e7528) &&
        (rhs->_M_string_length == 7)) &&
       (piVar3 = (int *)(rhs->_M_dataplus)._M_p,
       *(int *)((long)piVar3 + 3) == 0x29746573 && *piVar3 == 0x736e7528)) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,piVar2,(long)piVar2 + 7);
      ppVar10 = extraout_RAX_03;
      goto LAB_003ee02c;
    }
    if (*(int *)((long)piVar2 + 3) == 0x29746573 && *piVar2 == 0x736e7528) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar4 = (rhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar4,pcVar4 + rhs->_M_string_length);
      ppVar10 = extraout_RAX_01;
      goto LAB_003ee02c;
    }
  }
  if (((cmValue *)rhs->_M_string_length == (cmValue *)0x7) &&
     (piVar2 = (int *)(rhs->_M_dataplus)._M_p,
     *(int *)((long)piVar2 + 3) == 0x29746573 && *piVar2 == 0x736e7528)) {
    __return_storage_ptr__->first = true;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar4 = (lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar4,
               (pointer)((long)&this->Value + (long)pcVar4));
    ppVar10 = extraout_RAX_02;
  }
  else {
    value._M_str._0_4_ = t - NumberMinType;
    if ((uint)value._M_str < 2) {
      pVar11 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_70 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_60._16_8_,
                   (char *)(local_60._16_8_ + local_48._M_allocated_capacity));
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,pVar11.second,&local_71);
      }
      __return_storage_ptr__->first = pVar11.first;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,local_70,&local_70->first + local_68);
      ppVar10 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60;
      if (local_70 != ppVar10) {
        operator_delete(local_70,CONCAT44(local_60._4_4_,local_60._0_4_) + 1);
        ppVar10 = extraout_RAX_00;
      }
    }
    else if (t == StringType) {
      if ((this == (cmValue *)rhs->_M_string_length) &&
         ((pcVar4 = (lhs->_M_dataplus)._M_p, this == (cmValue *)0x0 ||
          (iVar7 = bcmp(pcVar4,(rhs->_M_dataplus)._M_p,(size_t)this), iVar7 == 0)))) {
        local_70 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,(pointer)((long)&this->Value + (long)pcVar4));
        bVar5 = true;
      }
      else {
        local_70 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60;
        local_60._0_4_ = 0x736e7528;
        local_68 = 7;
        local_60._4_4_ = 0x297465;
        bVar5 = false;
      }
      __return_storage_ptr__->first = bVar5;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,local_70,&local_70->first + local_68);
      ppVar10 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60;
      if (local_70 != ppVar10) {
        operator_delete(local_70,CONCAT44(local_60._4_4_,local_60._0_4_) + 1);
        ppVar10 = extraout_RAX_04;
      }
    }
    else {
      if (t != BoolType) {
        __assert_fail("false && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0x17e3,
                      "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                     );
      }
      value._M_len = (size_t)(lhs->_M_dataplus)._M_p;
      value._M_str._4_4_ = 0;
      bVar5 = cmValue::IsOn(this,value);
      value_00._M_str = extraout_RDX;
      value_00._M_len = (size_t)(rhs->_M_dataplus)._M_p;
      bVar6 = cmValue::IsOn((cmValue *)rhs->_M_string_length,value_00);
      bVar5 = bVar6 == bVar5;
      __return_storage_ptr__->first = bVar5;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      psVar8 = (string *)(local_60 + 0x10);
      if (bVar5) {
        psVar8 = lhs;
      }
      pcVar4 = (psVar8->_M_dataplus)._M_p;
      paVar9 = &local_48;
      if (bVar5) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&lhs->_M_string_length;
      }
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar4,
                 pcVar4 + paVar9->_M_allocated_capacity);
      ppVar10 = extraout_RAX;
    }
  }
LAB_003ee02c:
  if ((char *)local_60._16_8_ != pcVar1) {
    operator_delete((void *)local_60._16_8_,CONCAT44(local_48._12_4_,local_48._8_4_) + 1);
    ppVar10 = extraout_RAX_05;
  }
  return ppVar10;
}

Assistant:

static std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                       const std::string& rhs,
                                                       CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return { true, lhs };
  }
  if (lhs == null_ptr) {
    return { true, rhs };
  }
  if (rhs == null_ptr) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : null_ptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return { value.first,
               value.first ? std::string(value.second) : null_ptr };
    }
  }
  assert(false && "Unreachable!");
  return { false, null_ptr };
}